

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.h
# Opt level: O2

void __thiscall gui::TextBox::~TextBox(TextBox *this)

{
  (this->super_Widget).super_Drawable._vptr_Drawable = (_func_int **)&PTR__TextBox_001dd038;
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&(this->visibleString_).m_string);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&(this->defaultString_).m_string);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&(this->boxString_).m_string);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>_>_>
  ::~_Rb_tree(&(this->onEnterPressed).callbacks_._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>_>_>
  ::~_Rb_tree(&(this->onTextChange).callbacks_._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::Vector2<float>_&>_>_>_>
  ::~_Rb_tree(&(this->onClick).callbacks_._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>_>_>
  ::~_Rb_tree(&(this->onMouseRelease).callbacks_._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>,_std::_Select1st<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>_>_>_>
  ::~_Rb_tree(&(this->onMousePress).callbacks_._M_t);
  Widget::~Widget(&this->super_Widget);
  return;
}

Assistant:

virtual ~TextBox() = default;